

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool skipheader;
  bool useReturnPeriodFile;
  int iVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  size_type *psVar6;
  char *pcVar7;
  string *extraout_RDX;
  undefined8 uVar8;
  long lVar9;
  char **ppcVar10;
  string *psVar11;
  undefined1 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined1 local_1e5;
  char local_1e4 [3];
  allocator local_1e1;
  bool outputFlags [8];
  FILE *fout [2];
  string local_1a8;
  string parquetOutFiles [2];
  string local_148;
  string subfolder;
  string local_108;
  string local_e8;
  sigaction sa;
  
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  parquetOutFiles[0]._M_dataplus._M_p = (pointer)&parquetOutFiles[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)parquetOutFiles,"");
  parquetOutFiles[1]._M_dataplus._M_p = (pointer)&parquetOutFiles[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(parquetOutFiles + 1),"");
  local_1e4[0] = '\0';
  local_1e4[1] = '\0';
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  uVar12 = 0;
  local_1e5 = 0;
  useReturnPeriodFile = false;
  bVar4 = false;
switchD_0011026a_caseD_48:
  skipheader = bVar4;
  psVar6 = &subfolder._M_string_length;
  iVar5 = getopt(argc,argv,"vhrHFWMSK:fwsmO:o:P:p:");
  pcVar7 = _optarg;
  bVar4 = skipheader;
  if (iVar5 - 0x46U < 0x12) goto code_r0x0011024f;
  ppcVar10 = argv;
  switch(iVar5) {
  case 0x66:
    outputFlags[4] = true;
    break;
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x71:
  case 0x74:
  case 0x75:
    goto switchD_0011026a_caseD_47;
  case 0x6d:
    outputFlags[7] = true;
    break;
  case 0x6f:
    std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1a8);
    openpipe(1,(string *)&sa,fout);
    if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1))
    goto LAB_00110359;
    goto switchD_0011026a_caseD_48;
  case 0x70:
    psVar6 = &parquetOutFiles[1]._M_string_length;
    psVar11 = parquetOutFiles + 1;
    goto switchD_0011026a_caseD_4b;
  case 0x72:
    useReturnPeriodFile = true;
    goto switchD_0011026a_caseD_48;
  case 0x73:
    outputFlags[6] = true;
    break;
  case 0x76:
    goto switchD_00110290_caseD_76;
  case 0x77:
    outputFlags[5] = true;
    goto LAB_00110378;
  default:
    if (iVar5 == -1) {
      local_1e4[1] = local_1e5;
      local_1e4[0] = uVar12;
      if (argc == 1) {
        main_cold_1();
      }
      psVar11 = parquetOutFiles;
      lVar9 = 0;
      uVar12 = 0xa5;
      ppcVar10 = (char **)0x11187c;
      while( true ) {
        sa.__sigaction_handler.sa_handler = (__sighandler_t)(sa.sa_mask.__val + 1);
        sa.sa_mask.__val[0] = 0;
        sa.sa_mask.__val[1]._0_1_ = 0;
        pcVar7 = "PSEPT";
        if (lVar9 == 0) {
          pcVar7 = "EPT";
        }
        std::__cxx11::string::_M_replace((ulong)&sa,0,(char *)0x0,(ulong)pcVar7);
        cVar1 = local_1e4[lVar9];
        psVar6 = (size_type *)CONCAT71((int7)((ulong)psVar6 >> 8),cVar1);
        if ((cVar1 == '\0') &&
           ((fout[lVar9] != (FILE *)0x0 ||
            (iVar5 = std::__cxx11::string::compare((char *)psVar11), iVar5 != 0)))) {
          main_cold_2();
        }
        else if ((cVar1 != '\0') &&
                ((fout[lVar9] == (FILE *)0x0 &&
                 (iVar5 = std::__cxx11::string::compare((char *)psVar11), iVar5 == 0)))) {
          main_cold_5();
          if (local_148._M_dataplus._M_p != "") {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((size_type *)local_1a8._M_dataplus._M_p != psVar6) {
            operator_delete(local_1a8._M_dataplus._M_p);
          }
          if ((int)extraout_RDX == 1) {
            main_cold_4();
            uVar8 = extraout_RAX_00;
            if (extraout_RDX != parquetOutFiles + 1) {
              paVar13 = &parquetOutFiles[0].field_2;
              do {
                pcVar3 = (((string *)(paVar13 + -1))->_M_dataplus)._M_p;
                if (paVar13 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar3) {
                  operator_delete(pcVar3);
                }
                psVar11 = (string *)(paVar13 + -1);
                paVar13 = paVar13 + -2;
              } while (psVar11 != parquetOutFiles);
            }
          }
          else {
            paVar13 = &parquetOutFiles[1].field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
              operator_delete(subfolder._M_dataplus._M_p);
            }
            lVar9 = -0x40;
            do {
              pcVar3 = (((string *)(paVar13 + -1))->_M_dataplus)._M_p;
              if (paVar13 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3) {
                operator_delete(pcVar3);
              }
              paVar13 = paVar13 + -2;
              lVar9 = lVar9 + 0x20;
              uVar8 = extraout_RAX;
            } while (lVar9 != 0);
          }
          _Unwind_Resume(uVar8);
        }
        iVar5 = std::__cxx11::string::compare((char *)psVar11);
        if (iVar5 != 0) break;
        if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
          operator_delete(sa.__sigaction_handler.sa_handler);
        }
        lVar9 = lVar9 + 1;
        psVar11 = psVar11 + 1;
        if (lVar9 != 1) {
          progname = *argv;
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
          initstreams(&local_e8,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          std::__cxx11::string::string((string *)&local_1a8,progname,&local_1e1);
          paVar13 = &local_148.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
          logprintf(&local_1a8,&local_148,"starting process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar13) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p);
          }
          leccalc::doit(&subfolder,fout,useReturnPeriodFile,skipheader,outputFlags,true,
                        parquetOutFiles,progname);
          std::__cxx11::string::string((string *)&local_1a8,progname,&local_1e1);
          local_148._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
          logprintf(&local_1a8,&local_148,"finishing process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar13) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
            operator_delete(subfolder._M_dataplus._M_p);
          }
          lVar9 = 0;
          do {
            pcVar7 = *(char **)((long)&parquetOutFiles[1]._M_dataplus._M_p + lVar9);
            if (parquetOutFiles[1].field_2._M_local_buf + lVar9 != pcVar7) {
              operator_delete(pcVar7);
            }
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != -0x40);
          return 0;
        }
      }
      main_cold_3();
switchD_00110290_caseD_76:
      local_1e4[1] = local_1e5;
      local_1e4[0] = uVar12;
      fprintf(_stderr,"%s : version: %s\n",*ppcVar10,"");
      goto LAB_001107b3;
    }
    goto switchD_0011026a_caseD_47;
  }
  goto LAB_001103e3;
code_r0x0011024f:
  psVar11 = &subfolder;
  bVar4 = true;
  switch(iVar5) {
  case 0x46:
    outputFlags[0] = true;
    break;
  default:
    goto switchD_0011026a_caseD_47;
  case 0x48:
    goto switchD_0011026a_caseD_48;
  case 0x4d:
    outputFlags[3] = true;
    break;
  case 0x4f:
    std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1a8);
    openpipe(0,(string *)&sa,fout);
    bVar4 = skipheader;
    if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
LAB_00110359:
      operator_delete(sa.__sigaction_handler.sa_handler);
      bVar4 = skipheader;
    }
    goto switchD_0011026a_caseD_48;
  case 0x50:
    psVar6 = &parquetOutFiles[0]._M_string_length;
    psVar11 = parquetOutFiles;
  case 0x4b:
switchD_0011026a_caseD_4b:
    pcVar2 = (char *)*psVar6;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar2,(ulong)pcVar7);
    bVar4 = skipheader;
    goto switchD_0011026a_caseD_48;
  case 0x53:
    outputFlags[2] = true;
    break;
  case 0x57:
    outputFlags[1] = true;
LAB_00110378:
    local_1e5 = 1;
    bVar4 = skipheader;
    goto switchD_0011026a_caseD_48;
  }
LAB_001103e3:
  uVar12 = 1;
  bVar4 = skipheader;
  goto switchD_0011026a_caseD_48;
switchD_0011026a_caseD_47:
  local_1e4[1] = local_1e5;
  local_1e4[0] = uVar12;
  help();
LAB_001107b3:
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr, nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const int maxStreams = 2;
	std::string parquetOutFiles[maxStreams] = { "", "" };
	bool outputStreams[maxStreams] = { false, false };
	const bool ordFlag = true;   // Turn on ORD output

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHFWMSK:fwsmO:o:P:p:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'f':
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'W':
			outputFlags[AGG_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'w':
			outputFlags[OCC_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'S':
			outputFlags[AGG_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 's':
			outputFlags[OCC_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'M':
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'm':
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'O':
			openpipe(EPT, optarg, fout);
			break;
		case 'o':
			openpipe(PSEPT, optarg, fout);
			break;
		case 'P':
			parquetOutFiles[EPT] = optarg;
			break;
		case 'p':
			parquetOutFiles[PSEPT] = optarg;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	// Check for valid combinations of output streams and ORD files
	for (int i = 0; i < maxStreams; i++) {
		std::string streamName;
		if (i == EPT) streamName = "EPT";
		else if (i == PSEPT) streamName = "PSEPT";
		else streamName = "Error";   // Should never get here

		if (outputStreams[i] == false && 
		    (fout[i] != nullptr || parquetOutFiles[i] != "")) {
			fprintf(stderr, "WARNING: no valid output stream to fill %s file.\n",
				streamName.c_str());
		} else if (outputStreams[i] == true && fout[i] == nullptr
			   && parquetOutFiles[i] == "") {
			fprintf(stderr, "FATAL: no destination for %s output.\n",
				streamName.c_str());
			exit(EXIT_FAILURE);
		}
#ifndef HAVE_PARQUET
		if (parquetOutFiles[i] != "") {
			fprintf(stderr, "FATAL: Apache arrow libraries for "
					"parquet output are missing.\n Please "
					"install libraries and recompile to "
					"use this option.\n");
			exit(EXIT_FAILURE);
		}
#endif
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	} catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}